

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetLocalizedGMT
          (TimeZoneFormat *this,UnicodeString *text,ParsePosition *pos,UBool isShort,
          UBool *hasDigitOffset)

{
  ParsePosition *pPVar1;
  int8_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  long lVar5;
  int32_t defGMTZeroLen;
  UChar *defGMTZero;
  int32_t i;
  int32_t parsedLength;
  int32_t offset;
  int32_t start;
  UBool *hasDigitOffset_local;
  ParsePosition *pPStack_28;
  UBool isShort_local;
  ParsePosition *pos_local;
  UnicodeString *text_local;
  TimeZoneFormat *this_local;
  
  _offset = hasDigitOffset;
  hasDigitOffset_local._7_1_ = isShort;
  pPStack_28 = pos;
  pos_local = (ParsePosition *)text;
  text_local = (UnicodeString *)this;
  parsedLength = ParsePosition::getIndex(pos);
  i = 0;
  defGMTZero._4_4_ = 0;
  if (_offset != (UBool *)0x0) {
    *_offset = '\0';
  }
  i = parseOffsetLocalizedGMTPattern
                (this,(UnicodeString *)pos_local,parsedLength,hasDigitOffset_local._7_1_,
                 (int32_t *)((long)&defGMTZero + 4));
  if (defGMTZero._4_4_ < 1) {
    i = parseOffsetDefaultLocalizedGMT
                  (this,(UnicodeString *)pos_local,parsedLength,(int32_t *)((long)&defGMTZero + 4));
    pPVar1 = pos_local;
    iVar4 = parsedLength;
    if (defGMTZero._4_4_ < 1) {
      iVar3 = UnicodeString::length(&this->fGMTZeroFormat);
      iVar2 = UnicodeString::caseCompare
                        ((UnicodeString *)pPVar1,iVar4,iVar3,&this->fGMTZeroFormat,0);
      pPVar1 = pPStack_28;
      iVar4 = parsedLength;
      if (iVar2 == '\0') {
        iVar3 = UnicodeString::length(&this->fGMTZeroFormat);
        ParsePosition::setIndex(pPVar1,iVar4 + iVar3);
        this_local._4_4_ = 0;
      }
      else {
        defGMTZero._0_4_ = 0;
        while (*(short *)(ALT_GMT_STRINGS + (long)(int)defGMTZero * 8) != 0) {
          lVar5 = (long)(int)defGMTZero;
          iVar4 = u_strlen_63((UChar *)(ALT_GMT_STRINGS + lVar5 * 8));
          iVar2 = UnicodeString::caseCompare
                            ((UnicodeString *)pos_local,parsedLength,iVar4,
                             (char16_t *)(ALT_GMT_STRINGS + lVar5 * 8),0);
          if (iVar2 == '\0') {
            ParsePosition::setIndex(pPStack_28,parsedLength + iVar4);
            return 0;
          }
          defGMTZero._0_4_ = (int)defGMTZero + 1;
        }
        ParsePosition::setErrorIndex(pPStack_28,parsedLength);
        this_local._4_4_ = 0;
      }
    }
    else {
      if (_offset != (UBool *)0x0) {
        *_offset = '\x01';
      }
      ParsePosition::setIndex(pPStack_28,parsedLength + defGMTZero._4_4_);
      this_local._4_4_ = i;
    }
  }
  else {
    if (_offset != (UBool *)0x0) {
      *_offset = '\x01';
    }
    ParsePosition::setIndex(pPStack_28,parsedLength + defGMTZero._4_4_);
    this_local._4_4_ = i;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetLocalizedGMT(const UnicodeString& text, ParsePosition& pos, UBool isShort, UBool* hasDigitOffset) const {
    int32_t start = pos.getIndex();
    int32_t offset = 0;
    int32_t parsedLength = 0;

    if (hasDigitOffset) {
        *hasDigitOffset = FALSE;
    }

    offset = parseOffsetLocalizedGMTPattern(text, start, isShort, parsedLength);

    // For now, parseOffsetLocalizedGMTPattern handles both long and short
    // formats, no matter isShort is true or false. This might be changed in future
    // when strict parsing is necessary, or different set of patterns are used for
    // short/long formats.
#if 0
    if (parsedLength == 0) {
        offset = parseOffsetLocalizedGMTPattern(text, start, !isShort, parsedLength);
    }
#endif

    if (parsedLength > 0) {
        if (hasDigitOffset) {
            *hasDigitOffset = TRUE;
        }
        pos.setIndex(start + parsedLength);
        return offset;
    }

    // Try the default patterns
    offset = parseOffsetDefaultLocalizedGMT(text, start, parsedLength);
    if (parsedLength > 0) {
        if (hasDigitOffset) {
            *hasDigitOffset = TRUE;
        }
        pos.setIndex(start + parsedLength);
        return offset;
    }

    // Check if this is a GMT zero format
    if (text.caseCompare(start, fGMTZeroFormat.length(), fGMTZeroFormat, 0) == 0) {
        pos.setIndex(start + fGMTZeroFormat.length());
        return 0;
    }

    // Check if this is a default GMT zero format
    for (int32_t i = 0; ALT_GMT_STRINGS[i][0] != 0; i++) {
        const UChar* defGMTZero = ALT_GMT_STRINGS[i];
        int32_t defGMTZeroLen = u_strlen(defGMTZero);
        if (text.caseCompare(start, defGMTZeroLen, defGMTZero, 0) == 0) {
            pos.setIndex(start + defGMTZeroLen);
            return 0;
        }
    }

    // Nothing matched
    pos.setErrorIndex(start);
    return 0;
}